

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::AndroidExtensionPackES31ATests::init
          (AndroidExtensionPackES31ATests *this,EVP_PKEY_CTX *ctx)

{
  string *__return_storage_ptr__;
  Context *pCVar1;
  TestContext *testCtx;
  int extraout_EAX;
  TestNode *pTVar2;
  ImplementationLimitCase *this_00;
  char *pcVar3;
  SubExtensionCase *this_01;
  char *pcVar4;
  RenderContext *renderCtx;
  ContextInfo *contextInfo;
  TestCaseGroup *this_02;
  char *extraout_RDX;
  char *extraout_RDX_00;
  TestCaseGroup *groupES32;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *local_1b0;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *children_1;
  TestCaseGroup *groupES31;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *local_188;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *children;
  TestCaseGroup *group_2;
  ShaderLibrary shaderLibrary;
  undefined1 local_140 [8];
  string description;
  string name;
  int ndx_1;
  TestCaseGroup *group_1;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  int ndx;
  TestNode *local_18;
  TestCaseGroup *group;
  AndroidExtensionPackES31ATests *this_local;
  
  group = (TestCaseGroup *)this;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"limits",
             "Implementation limits");
  local_18 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (local_28 = 0; pTVar2 = local_18, local_28 < 4; local_28 = local_28 + 1) {
    this_00 = (ImplementationLimitCase *)operator_new(0x80);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = init::limits[local_28].name;
    std::__cxx11::string::string((string *)&local_c8);
    std::operator+(&local_a8,&local_c8,"Check ");
    std::operator+(&local_88,&local_a8,init::limits[local_28].name);
    std::operator+(&local_68,&local_88," is at least ");
    de::toString<int>(&local_e8,&init::limits[local_28].limit);
    std::operator+(&local_48,&local_68,&local_e8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ImplementationLimitCase::ImplementationLimitCase
              (this_00,pCVar1,pcVar4,pcVar3,init::limits[local_28].target,
               init::limits[local_28].limit);
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"extensions",
             "Required extensions");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pcVar4 = extraout_RDX;
  for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 0x14;
      name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    __return_storage_ptr__ = (string *)((long)&description.field_2 + 8);
    Functional::(anonymous_namespace)::genExtensionTestName_abi_cxx11_
              (__return_storage_ptr__,
               (_anonymous_namespace_ *)init::subExtensions[(int)name.field_2._12_4_],pcVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shaderLibrary.m_contextInfo,"Check that extension ",__return_storage_ptr__);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shaderLibrary.m_contextInfo," is supported if extension pack is supported");
    std::__cxx11::string::~string((string *)&shaderLibrary.m_contextInfo);
    this_01 = (SubExtensionCase *)operator_new(0x98);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::SubExtensionCase::SubExtensionCase
              (this_01,pCVar1,pcVar4,pcVar3,init::subExtensions[(int)name.field_2._12_4_]);
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
    pcVar4 = extraout_RDX_00;
  }
  testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  renderCtx = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  contextInfo = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderLibrary::ShaderLibrary((ShaderLibrary *)&group_2,testCtx,renderCtx,contextInfo);
  this_02 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (this_02,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "shaders","Shader tests");
  children = (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)this_02;
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&groupES31,
             (ShaderLibrary *)&group_2,"shaders/es31/android_extension_pack.test");
  local_188 = (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&groupES31;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es31",
             "GLSL ES 3.1 Shader tests",local_188);
  children_1 = (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)pTVar2;
  tcu::TestNode::addChild((TestNode *)children,pTVar2);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&groupES31);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&groupES32,
             (ShaderLibrary *)&group_2,"shaders/es32/android_extension_pack.test");
  local_1b0 = (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&groupES32;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"es32",
             "GLSL ES 3.2 Shader tests",local_1b0);
  tcu::TestNode::addChild((TestNode *)children,pTVar2);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&groupES32);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)children);
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&group_2);
  return extraout_EAX;
}

Assistant:

void AndroidExtensionPackES31ATests::init (void)
{
	// .limits
	{
		static const struct
		{
			const char*	name;
			glw::GLenum	target;
			int			limit;
		} limits[] =
		{
			{
				"max_fragment_atomic_counter_buffers",
				GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS,
				1
			},
			{
				"max_fragment_atomic_counters",
				GL_MAX_FRAGMENT_ATOMIC_COUNTERS,
				8
			},
			{
				"max_fragment_image_uniforms",
				GL_MAX_FRAGMENT_IMAGE_UNIFORMS,
				4
			},
			{
				"max_fragment_shader_storage_blocks",
				GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS,
				4
			},
		};

		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "limits", "Implementation limits");
		addChild(group);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(limits); ++ndx)
			group->addChild(new ImplementationLimitCase(m_context,
														limits[ndx].name,
														(std::string() + "Check " + limits[ndx].name + " is at least " + de::toString(limits[ndx].limit)).c_str(),
														limits[ndx].target,
														limits[ndx].limit));
	}

	// .extensions
	{
		static const char* const subExtensions[] =
		{
			"GL_KHR_debug",
			"GL_KHR_texture_compression_astc_ldr",
			"GL_KHR_blend_equation_advanced",
			"GL_OES_sample_shading",
			"GL_OES_sample_variables",
			"GL_OES_shader_image_atomic",
			"GL_OES_shader_multisample_interpolation",
			"GL_OES_texture_stencil8",
			"GL_OES_texture_storage_multisample_2d_array",
			"GL_EXT_copy_image",
			"GL_EXT_draw_buffers_indexed",
			"GL_EXT_geometry_shader",
			"GL_EXT_gpu_shader5",
			"GL_EXT_primitive_bounding_box",
			"GL_EXT_shader_io_blocks",
			"GL_EXT_tessellation_shader",
			"GL_EXT_texture_border_clamp",
			"GL_EXT_texture_buffer",
			"GL_EXT_texture_cube_map_array",
			"GL_EXT_texture_sRGB_decode",
		};

		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "extensions", "Required extensions");
		addChild(group);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(subExtensions); ++ndx)
		{
			const std::string name			= genExtensionTestName(subExtensions[ndx]);
			const std::string description	= "Check that extension " + name + " is supported if extension pack is supported";
			group->addChild(new SubExtensionCase(m_context, name.c_str(), description.c_str(), subExtensions[ndx]));
		}
	}

	// .shaders
	{
		gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		tcu::TestCaseGroup* const			group			= new tcu::TestCaseGroup(m_testCtx, "shaders", "Shader tests");

		{
			const std::vector<tcu::TestNode*>&	children		= shaderLibrary.loadShaderFile("shaders/es31/android_extension_pack.test");
			tcu::TestCaseGroup* const			groupES31		= new tcu::TestCaseGroup(m_testCtx, "es31", "GLSL ES 3.1 Shader tests", children);

			group->addChild(groupES31);
		}

		{
			const std::vector<tcu::TestNode*>&	children		= shaderLibrary.loadShaderFile("shaders/es32/android_extension_pack.test");
			tcu::TestCaseGroup* const			groupES32		= new tcu::TestCaseGroup(m_testCtx, "es32", "GLSL ES 3.2 Shader tests", children);

			group->addChild(groupES32);
		}

		addChild(group);
	}
}